

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O0

CURLcode inflate_stream(Curl_easy *data,Curl_cwriter *writer,int type,zlibInitState started)

{
  int iVar1;
  Curl_cwriter *pCVar2;
  bool bVar3;
  int iVar4;
  CURLcode CVar5;
  Curl_cwriter **z_00;
  Curl_cwtype *buf;
  int status;
  char *decomp;
  CURLcode result;
  _Bool done;
  Bytef *orig_in;
  uInt nread;
  z_stream *z;
  zlib_writer *zp;
  zlibInitState started_local;
  int type_local;
  Curl_cwriter *writer_local;
  Curl_easy *data_local;
  
  z_00 = &writer[1].next;
  iVar1 = *(int *)&writer[1].ctx;
  pCVar2 = *z_00;
  bVar3 = false;
  decomp._0_4_ = CURLE_OK;
  if ((((*(int *)&writer[1].cwt == 1) || (*(int *)&writer[1].cwt == 2)) ||
      (*(int *)&writer[1].cwt == 6)) || (*(int *)&writer[1].cwt == 5)) {
    buf = (Curl_cwtype *)(*Curl_cmalloc)(0x4000);
    if (buf == (Curl_cwtype *)0x0) {
      data_local._4_4_ =
           exit_zlib(data,(z_stream *)z_00,(zlibInitState *)(writer + 1),CURLE_OUT_OF_MEMORY);
    }
    else {
LAB_00126694:
      if (!bVar3) {
        bVar3 = true;
        writer[2].cwt = buf;
        *(undefined4 *)&writer[2].next = 0x4000;
        iVar4 = inflate(z_00,5);
        if ((*(int *)&writer[2].next != 0x4000) && ((iVar4 == 0 || (iVar4 == 1)))) {
          *(zlibInitState *)&writer[1].cwt = started;
          decomp._0_4_ = Curl_cwriter_write(data,writer->next,type,(char *)buf,
                                            (ulong)(0x4000 - *(int *)&writer[2].next));
          if ((CURLcode)decomp != CURLE_OK) {
            exit_zlib(data,(z_stream *)z_00,(zlibInitState *)(writer + 1),(CURLcode)decomp);
            goto LAB_00126893;
          }
        }
        switch(iVar4) {
        case 0:
          bVar3 = false;
          break;
        case 1:
          decomp._0_4_ = process_trailer(data,(zlib_writer *)writer);
          break;
        case -5:
          break;
        default:
          CVar5 = process_zlib_error(data,(z_stream *)z_00);
          decomp._0_4_ = exit_zlib(data,(z_stream *)z_00,(zlibInitState *)(writer + 1),CVar5);
          break;
        case -3:
          if (*(int *)&writer[1].cwt == 1) {
            inflateEnd(z_00);
            iVar4 = inflateInit2_(z_00,0xfffffff1,"1.2.11",0x70);
            if (iVar4 == 0) {
              *z_00 = pCVar2;
              *(int *)&writer[1].ctx = iVar1;
              *(undefined4 *)&writer[1].cwt = 2;
              *(undefined4 *)((long)&writer[1].cwt + 4) = 4;
              bVar3 = false;
              break;
            }
            *(undefined4 *)&writer[1].cwt = 0;
          }
          CVar5 = process_zlib_error(data,(z_stream *)z_00);
          decomp._0_4_ = exit_zlib(data,(z_stream *)z_00,(zlibInitState *)(writer + 1),CVar5);
          break;
        }
        goto LAB_00126694;
      }
LAB_00126893:
      (*Curl_cfree)(buf);
      if ((iVar1 != 0) && (*(int *)&writer[1].cwt == 1)) {
        *(zlibInitState *)&writer[1].cwt = started;
      }
      data_local._4_4_ = (CURLcode)decomp;
    }
  }
  else {
    data_local._4_4_ =
         exit_zlib(data,(z_stream *)z_00,(zlibInitState *)(writer + 1),CURLE_WRITE_ERROR);
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode inflate_stream(struct Curl_easy *data,
                               struct Curl_cwriter *writer, int type,
                               zlibInitState started)
{
  struct zlib_writer *zp = (struct zlib_writer *) writer;
  z_stream *z = &zp->z;         /* zlib state structure */
  uInt nread = z->avail_in;
  Bytef *orig_in = z->next_in;
  bool done = FALSE;
  CURLcode result = CURLE_OK;   /* Curl_client_write status */
  char *decomp;                 /* Put the decompressed data here. */

  /* Check state. */
  if(zp->zlib_init != ZLIB_INIT &&
     zp->zlib_init != ZLIB_INFLATING &&
     zp->zlib_init != ZLIB_INIT_GZIP &&
     zp->zlib_init != ZLIB_GZIP_INFLATING)
    return exit_zlib(data, z, &zp->zlib_init, CURLE_WRITE_ERROR);

  /* Dynamically allocate a buffer for decompression because it is uncommonly
     large to hold on the stack */
  decomp = malloc(DSIZ);
  if(!decomp)
    return exit_zlib(data, z, &zp->zlib_init, CURLE_OUT_OF_MEMORY);

  /* because the buffer size is fixed, iteratively decompress and transfer to
     the client via next_write function. */
  while(!done) {
    int status;                   /* zlib status */
    done = TRUE;

    /* (re)set buffer for decompressed output for every iteration */
    z->next_out = (Bytef *) decomp;
    z->avail_out = DSIZ;

#ifdef Z_BLOCK
    /* Z_BLOCK is only available in zlib ver. >= 1.2.0.5 */
    status = inflate(z, Z_BLOCK);
#else
    /* fallback for zlib ver. < 1.2.0.5 */
    status = inflate(z, Z_SYNC_FLUSH);
#endif

    /* Flush output data if some. */
    if(z->avail_out != DSIZ) {
      if(status == Z_OK || status == Z_STREAM_END) {
        zp->zlib_init = started;      /* Data started. */
        result = Curl_cwriter_write(data, writer->next, type, decomp,
                                     DSIZ - z->avail_out);
        if(result) {
          exit_zlib(data, z, &zp->zlib_init, result);
          break;
        }
      }
    }

    /* Dispatch by inflate() status. */
    switch(status) {
    case Z_OK:
      /* Always loop: there may be unflushed latched data in zlib state. */
      done = FALSE;
      break;
    case Z_BUF_ERROR:
      /* No more data to flush: just exit loop. */
      break;
    case Z_STREAM_END:
      result = process_trailer(data, zp);
      break;
    case Z_DATA_ERROR:
      /* some servers seem to not generate zlib headers, so this is an attempt
         to fix and continue anyway */
      if(zp->zlib_init == ZLIB_INIT) {
        /* Do not use inflateReset2(): only available since zlib 1.2.3.4. */
        (void) inflateEnd(z);     /* do not care about the return code */
        if(inflateInit2(z, -MAX_WBITS) == Z_OK) {
          z->next_in = orig_in;
          z->avail_in = nread;
          zp->zlib_init = ZLIB_INFLATING;
          zp->trailerlen = 4; /* Tolerate up to 4 unknown trailer bytes. */
          done = FALSE;
          break;
        }
        zp->zlib_init = ZLIB_UNINIT;    /* inflateEnd() already called. */
      }
      result = exit_zlib(data, z, &zp->zlib_init, process_zlib_error(data, z));
      break;
    default:
      result = exit_zlib(data, z, &zp->zlib_init, process_zlib_error(data, z));
      break;
    }
  }
  free(decomp);

  /* We are about to leave this call so the `nread' data bytes will not be seen
     again. If we are in a state that would wrongly allow restart in raw mode
     at the next call, assume output has already started. */
  if(nread && zp->zlib_init == ZLIB_INIT)
    zp->zlib_init = started;      /* Cannot restart anymore. */

  return result;
}